

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

int __thiscall
chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes
          (ChTriangleMeshConnected *this,double tolerance)

{
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  int local_9c;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> processed_verts;
  vector<int,_std::allocator<int>_> new_indexes;
  ChVector<double> v;
  
  processed_verts.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  processed_verts.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  processed_verts.
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&new_indexes,
             ((long)(this->m_vertices).
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&v);
  this_00 = &this->m_vertices;
  uVar3 = 0;
  local_9c = 0;
  do {
    if ((ulong)(((long)(this->m_vertices).
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_vertices).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar3) {
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
                (this_00,&processed_verts);
      pCVar2 = (this->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar4 = pCVar2->m_data + 2;
      lVar6 = ((long)(this->m_face_v_indices).
                     super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0xc;
      while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
        ((ChVector<int> *)(piVar4 + -2))->m_data[0] =
             new_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[((ChVector<int> *)(piVar4 + -2))->m_data[0]];
        piVar4[-1] = new_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[piVar4[-1]];
        *piVar4 = new_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[*piVar4];
        piVar4 = piVar4 + 3;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&new_indexes.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
      ~_Vector_base(&processed_verts.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   );
      return local_9c;
    }
    lVar6 = 0x10;
    for (uVar5 = 0;
        uVar5 < (ulong)(((long)processed_verts.
                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)processed_verts.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar5 = uVar5 + 1)
    {
      pCVar1 = (this_00->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      v.m_data._0_16_ =
           vsubpd_avx(*(undefined1 (*) [16])pCVar1[uVar3].m_data,
                      *(undefined1 (*) [16])
                       ((long)(processed_verts.
                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar6 + -0x10));
      v.m_data[2] = pCVar1[uVar3].m_data[2] -
                    *(double *)
                     ((long)(processed_verts.
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar6);
      dVar8 = ChVector<double>::Length2(&v);
      if (dVar8 < tolerance) {
        local_9c = local_9c + 1;
        goto LAB_00d5a013;
      }
      lVar6 = lVar6 + 0x18;
    }
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (&processed_verts,
               (this_00->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar3);
    uVar5 = (ulong)((int)(((long)processed_verts.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)processed_verts.
                                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18) - 1);
LAB_00d5a013:
    new_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar3] = (int)uVar5;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int ChTriangleMeshConnected::RepairDuplicateVertexes(const double tolerance) {
    int nmerged = 0;
    std::vector<ChVector<>> processed_verts;
    std::vector<int> new_indexes(m_vertices.size());

    // merge vertexes
    for (int i = 0; i < m_vertices.size(); ++i) {
        bool tomerge = false;
        for (int j = 0; j < processed_verts.size(); ++j) {
            if ((m_vertices[i] - processed_verts[j]).Length2() < tolerance) {
                tomerge = true;
                ++nmerged;
                new_indexes[i] = j;
                break;
            }
        }
        if (!tomerge) {
            processed_verts.push_back(m_vertices[i]);
            new_indexes[i] = (int)processed_verts.size() - 1;
        }
    }

    m_vertices = processed_verts;

    // Update the merged vertexes also in face indexes to vertexes
    // Note: we DO NOT update the normal, color, UV, or material indices!
    for (int i = 0; i < this->m_face_v_indices.size(); ++i) {
        m_face_v_indices[i].x() = new_indexes[m_face_v_indices[i].x()];
        m_face_v_indices[i].y() = new_indexes[m_face_v_indices[i].y()];
        m_face_v_indices[i].z() = new_indexes[m_face_v_indices[i].z()];
    }

    return nmerged;
}